

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlValidateOneAttribute
              (xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem,xmlAttrPtr attr,xmlChar *value)

{
  xmlAttributeType type;
  xmlChar *prefix;
  xmlHashTablePtr pxVar1;
  int iVar2;
  uint uVar3;
  xmlChar *pxVar4;
  xmlIDPtr pxVar5;
  xmlRefPtr pxVar6;
  void *pvVar7;
  xmlChar *key2;
  undefined8 *puVar8;
  long *plVar9;
  xmlChar *key;
  _xmlDtd *p_Var10;
  uint local_78;
  void *local_70;
  xmlChar fn [50];
  
  if (doc == (xmlDocPtr)0x0) {
    return 0;
  }
  p_Var10 = doc->intSubset;
  if (p_Var10 == (_xmlDtd *)0x0) {
    if (elem == (xmlNodePtr)0x0) {
      return 0;
    }
    if (doc->extSubset == (_xmlDtd *)0x0) {
      return 0;
    }
  }
  else if (elem == (xmlNodePtr)0x0) {
    return 0;
  }
  pxVar4 = elem->name;
  if (attr == (xmlAttrPtr)0x0 || pxVar4 == (xmlChar *)0x0) {
    return 0;
  }
  key = attr->name;
  if (key == (xmlChar *)0x0) {
    return 0;
  }
  if (attr->ns == (xmlNs *)0x0) {
    key2 = (xmlChar *)0x0;
  }
  else {
    key2 = attr->ns->prefix;
  }
  if ((elem->ns != (xmlNs *)0x0) && (prefix = elem->ns->prefix, prefix != (xmlChar *)0x0)) {
    pxVar4 = xmlBuildQName(pxVar4,prefix,fn,0x32);
    if (pxVar4 == (xmlChar *)0x0) {
      xmlVErrMemory(ctxt);
      return 0;
    }
    if (((doc->intSubset == (_xmlDtd *)0x0) ||
        (pxVar1 = (xmlHashTablePtr)doc->intSubset->attributes, pxVar1 == (xmlHashTablePtr)0x0)) ||
       (local_70 = xmlHashLookup3(pxVar1,attr->name,key2,pxVar4), local_70 == (void *)0x0)) {
      if ((doc->extSubset == (_xmlDtd *)0x0) ||
         (pxVar1 = (xmlHashTablePtr)doc->extSubset->attributes, pxVar1 == (xmlHashTablePtr)0x0)) {
        local_70 = (void *)0x0;
      }
      else {
        local_70 = xmlHashLookup3(pxVar1,attr->name,key2,pxVar4);
      }
    }
    if ((pxVar4 != fn) && (pxVar4 != elem->name)) {
      (*xmlFree)(pxVar4);
    }
    if (local_70 != (void *)0x0) goto LAB_0015a836;
    p_Var10 = doc->intSubset;
    pxVar4 = elem->name;
    key = attr->name;
  }
  if ((((p_Var10 == (_xmlDtd *)0x0) ||
       ((xmlHashTablePtr)p_Var10->attributes == (xmlHashTablePtr)0x0)) ||
      (local_70 = xmlHashLookup3((xmlHashTablePtr)p_Var10->attributes,key,key2,pxVar4),
      local_70 == (void *)0x0)) &&
     (((doc->extSubset == (_xmlDtd *)0x0 ||
       (pxVar1 = (xmlHashTablePtr)doc->extSubset->attributes, pxVar1 == (xmlHashTablePtr)0x0)) ||
      (local_70 = xmlHashLookup3(pxVar1,attr->name,key2,elem->name), local_70 == (void *)0x0)))) {
    xmlDoErrValid(ctxt,elem,XML_DTD_UNKNOWN_ATTRIBUTE,2,attr->name,elem->name,(xmlChar *)0x0,0,
                  "No declaration for attribute %s of element %s\n",attr->name,elem->name,0);
    return 0;
  }
LAB_0015a836:
  if (((attr->atype == XML_ATTRIBUTE_ID) && (attr->id != (_xmlID *)0x0)) &&
     ((xmlHashTablePtr)doc->ids != (xmlHashTablePtr)0x0)) {
    xmlHashRemoveEntry((xmlHashTablePtr)doc->ids,attr->id->value,xmlFreeIDTableEntry);
  }
  type = *(xmlAttributeType *)((long)local_70 + 0x50);
  attr->atype = type;
  iVar2 = xmlValidateAttributeValueInternal(doc,type,value);
  if (iVar2 == 0) {
    xmlDoErrValid(ctxt,elem,XML_DTD_ATTRIBUTE_VALUE,2,attr->name,elem->name,(xmlChar *)0x0,0,
                  "Syntax of value for attribute %s of %s is not valid\n",attr->name,elem->name,0);
  }
  local_78 = (uint)(iVar2 != 0);
  if ((*(int *)((long)local_70 + 0x54) == 4) &&
     (iVar2 = xmlStrEqual(value,*(xmlChar **)((long)local_70 + 0x58)), iVar2 == 0)) {
    local_78 = 0;
    xmlDoErrValid(ctxt,elem,XML_DTD_ATTRIBUTE_DEFAULT,2,attr->name,elem->name,
                  *(xmlChar **)((long)local_70 + 0x58),0,
                  "Value for attribute %s of %s is different from default \"%s\"\n",attr->name,
                  elem->name,*(xmlChar **)((long)local_70 + 0x58));
  }
  iVar2 = *(int *)((long)local_70 + 0x50);
  if (iVar2 == 2) {
    pxVar5 = xmlAddID(ctxt,doc,value,attr);
    if (pxVar5 == (xmlIDPtr)0x0) {
      local_78 = 0;
    }
    iVar2 = *(int *)((long)local_70 + 0x50);
  }
  if (iVar2 - 3U < 2) {
    pxVar6 = xmlAddRef(ctxt,doc,value,attr);
    if (pxVar6 == (xmlRefPtr)0x0) {
      local_78 = 0;
    }
    iVar2 = *(int *)((long)local_70 + 0x50);
  }
  if (iVar2 == 10) {
    puVar8 = *(undefined8 **)((long)local_70 + 0x60);
    if ((((doc->intSubset == (_xmlDtd *)0x0) ||
         (pxVar1 = (xmlHashTablePtr)doc->intSubset->notations, pxVar1 == (xmlHashTablePtr)0x0)) ||
        (pvVar7 = xmlHashLookup(pxVar1,value), pvVar7 == (void *)0x0)) &&
       (((doc->extSubset == (_xmlDtd *)0x0 ||
         (pxVar1 = (xmlHashTablePtr)doc->extSubset->notations, pxVar1 == (xmlHashTablePtr)0x0)) ||
        (pvVar7 = xmlHashLookup(pxVar1,value), pvVar7 == (void *)0x0)))) {
      local_78 = 0;
      xmlDoErrValid(ctxt,elem,XML_DTD_UNKNOWN_NOTATION,2,value,attr->name,elem->name,0,
                    "Value \"%s\" for attribute %s of %s is not a declared Notation\n",value,
                    attr->name,elem->name);
    }
    for (; puVar8 != (undefined8 *)0x0; puVar8 = (undefined8 *)*puVar8) {
      iVar2 = xmlStrEqual((xmlChar *)puVar8[1],value);
      if (iVar2 != 0) goto LAB_0015aa69;
    }
    local_78 = 0;
    xmlDoErrValid(ctxt,elem,XML_DTD_NOTATION_VALUE,2,value,attr->name,elem->name,0,
                  "Value \"%s\" for attribute %s of %s is not among the enumerated notations\n",
                  value,attr->name,elem->name);
  }
LAB_0015aa69:
  if (*(int *)((long)local_70 + 0x50) == 9) {
    plVar9 = (long *)((long)local_70 + 0x60);
    do {
      plVar9 = (long *)*plVar9;
      if (plVar9 == (long *)0x0) {
        local_78 = 0;
        xmlDoErrValid(ctxt,elem,XML_DTD_ATTRIBUTE_VALUE,2,value,attr->name,elem->name,0,
                      "Value \"%s\" for attribute %s of %s is not among the enumerated set\n",value,
                      attr->name,elem->name);
        break;
      }
      iVar2 = xmlStrEqual((xmlChar *)plVar9[1],value);
    } while (iVar2 == 0);
  }
  if ((*(int *)((long)local_70 + 0x54) == 4) &&
     (iVar2 = xmlStrEqual(*(xmlChar **)((long)local_70 + 0x58),value), iVar2 == 0)) {
    local_78 = 0;
    xmlDoErrValid(ctxt,elem,XML_DTD_ATTRIBUTE_VALUE,2,attr->name,elem->name,
                  *(xmlChar **)((long)local_70 + 0x58),0,
                  "Value for attribute %s of %s must be \"%s\"\n",attr->name,elem->name,
                  *(xmlChar **)((long)local_70 + 0x58));
  }
  uVar3 = xmlValidateAttributeValue2
                    (ctxt,doc,attr->name,*(xmlAttributeType *)((long)local_70 + 0x50),value);
  return uVar3 & local_78;
}

Assistant:

int
xmlValidateOneAttribute(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                        xmlNodePtr elem, xmlAttrPtr attr, const xmlChar *value)
{
    xmlAttributePtr attrDecl =  NULL;
    const xmlChar *aprefix;
    int val;
    int ret = 1;

    CHECK_DTD;
    if ((elem == NULL) || (elem->name == NULL)) return(0);
    if ((attr == NULL) || (attr->name == NULL)) return(0);

    aprefix = (attr->ns != NULL) ? attr->ns->prefix : NULL;

    if ((elem->ns != NULL) && (elem->ns->prefix != NULL)) {
	xmlChar fn[50];
	xmlChar *fullname;

	fullname = xmlBuildQName(elem->name, elem->ns->prefix, fn, 50);
	if (fullname == NULL) {
            xmlVErrMemory(ctxt);
	    return(0);
        }
        attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, fullname,
                                      attr->name, aprefix);
        if ((attrDecl == NULL) && (doc->extSubset != NULL))
            attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, fullname,
                                          attr->name, aprefix);
	if ((fullname != fn) && (fullname != elem->name))
	    xmlFree(fullname);
    }
    if (attrDecl == NULL) {
        attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, elem->name,
                                      attr->name, aprefix);
        if ((attrDecl == NULL) && (doc->extSubset != NULL))
            attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, elem->name,
                                          attr->name, aprefix);
    }


    /* Validity Constraint: Attribute Value Type */
    if (attrDecl == NULL) {
	xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_ATTRIBUTE,
	       "No declaration for attribute %s of element %s\n",
	       attr->name, elem->name, NULL);
	return(0);
    }
    if (attr->atype == XML_ATTRIBUTE_ID)
        xmlRemoveID(doc, attr);
    attr->atype = attrDecl->atype;

    val = xmlValidateAttributeValueInternal(doc, attrDecl->atype, value);
    if (val == 0) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_VALUE,
	   "Syntax of value for attribute %s of %s is not valid\n",
	       attr->name, elem->name, NULL);
        ret = 0;
    }

    /* Validity constraint: Fixed Attribute Default */
    if (attrDecl->def == XML_ATTRIBUTE_FIXED) {
	if (!xmlStrEqual(value, attrDecl->defaultValue)) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_DEFAULT,
	   "Value for attribute %s of %s is different from default \"%s\"\n",
		   attr->name, elem->name, attrDecl->defaultValue);
	    ret = 0;
	}
    }

    /* Validity Constraint: ID uniqueness */
    if (attrDecl->atype == XML_ATTRIBUTE_ID) {
        if (xmlAddID(ctxt, doc, value, attr) == NULL)
	    ret = 0;
    }

    if ((attrDecl->atype == XML_ATTRIBUTE_IDREF) ||
	(attrDecl->atype == XML_ATTRIBUTE_IDREFS)) {
        if (xmlAddRef(ctxt, doc, value, attr) == NULL)
	    ret = 0;
    }

    /* Validity Constraint: Notation Attributes */
    if (attrDecl->atype == XML_ATTRIBUTE_NOTATION) {
        xmlEnumerationPtr tree = attrDecl->tree;
        xmlNotationPtr nota;

        /* First check that the given NOTATION was declared */
	nota = xmlGetDtdNotationDesc(doc->intSubset, value);
	if (nota == NULL)
	    nota = xmlGetDtdNotationDesc(doc->extSubset, value);

	if (nota == NULL) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_NOTATION,
       "Value \"%s\" for attribute %s of %s is not a declared Notation\n",
		   value, attr->name, elem->name);
	    ret = 0;
        }

	/* Second, verify that it's among the list */
	while (tree != NULL) {
	    if (xmlStrEqual(tree->name, value)) break;
	    tree = tree->next;
	}
	if (tree == NULL) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_NOTATION_VALUE,
"Value \"%s\" for attribute %s of %s is not among the enumerated notations\n",
		   value, attr->name, elem->name);
	    ret = 0;
	}
    }

    /* Validity Constraint: Enumeration */
    if (attrDecl->atype == XML_ATTRIBUTE_ENUMERATION) {
        xmlEnumerationPtr tree = attrDecl->tree;
	while (tree != NULL) {
	    if (xmlStrEqual(tree->name, value)) break;
	    tree = tree->next;
	}
	if (tree == NULL) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_VALUE,
       "Value \"%s\" for attribute %s of %s is not among the enumerated set\n",
		   value, attr->name, elem->name);
	    ret = 0;
	}
    }

    /* Fixed Attribute Default */
    if ((attrDecl->def == XML_ATTRIBUTE_FIXED) &&
        (!xmlStrEqual(attrDecl->defaultValue, value))) {
	xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_VALUE,
	   "Value for attribute %s of %s must be \"%s\"\n",
	       attr->name, elem->name, attrDecl->defaultValue);
        ret = 0;
    }

    /* Extra check for the attribute value */
    ret &= xmlValidateAttributeValue2(ctxt, doc, attr->name,
				      attrDecl->atype, value);

    return(ret);
}